

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

int __thiscall Snes_Spc::dsp_read(Snes_Spc *this,rel_time_t time)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (this->m).dsp_time;
  uVar2 = time - (this->reg_times[(this->m).smp_regs[0][2] & 0x7f] + iVar1);
  if (-1 < (int)uVar2) {
    uVar2 = uVar2 & 0x7fffffe0;
    (this->m).dsp_time = iVar1 + uVar2 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar2 + 0x20);
  }
  return (int)(this->dsp).m.regs[(this->m).smp_regs[0][2] & 0x7f];
}

Assistant:

int Snes_Spc::dsp_read( rel_time_t time )
{
	RUN_DSP( time, reg_times [REGS [r_dspaddr] & 0x7F] );
	
	int result = dsp.read( REGS [r_dspaddr] & 0x7F );
	
	#ifdef SPC_DSP_READ_HOOK
		SPC_DSP_READ_HOOK( spc_time + time, (REGS [r_dspaddr] & 0x7F), result );
	#endif
	
	return result;
}